

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

Index __thiscall
PlanningUnitMADPDiscrete::GetTimeStepForJAOHI(PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  ulong uVar1;
  Index IVar2;
  JointActionObservationHistoryTree *pJVar3;
  ulong uVar4;
  E *this_00;
  
  if ((this->_m_params)._m_jointActionObservationHistories == true) {
    pJVar3 = GetJointActionObservationHistoryTree(this,jaohI);
    IVar2 = (Index)(((pJVar3->super_TreeNode<JointActionObservationHistory>)._m_containedElem)->
                   super_JointHistory).super_History._m_length;
  }
  else {
    uVar1 = (this->super_PlanningUnit)._m_horizon;
    IVar2 = 0xffffffff;
    if (uVar1 != 0) {
      if (uVar1 == 999999) {
        this_00 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_00,
             "PlanningUnitMADPDiscrete::GetTimeStepForJAOHI does not work yet for infinite-horizon case"
            );
        __cxa_throw(this_00,&E::typeinfo,E::~E);
      }
      uVar4 = 0;
      do {
        if (jaohI < (this->_m_firstJAOHIforT).
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar4]) break;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (uVar4 < uVar1);
      IVar2 = (int)uVar4 - 1;
    }
  }
  return IVar2;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetTimeStepForJAOHI(LIndex jaohI) const
{
    // copied from GetTimeStepForJOHI
    if(_m_params.GetComputeJointActionObservationHistories())
        return(GetJointActionObservationHistoryTree(jaohI)->
               GetContainedElement()->GetLength() ); 
    else
    {
        Index t = 0;
        if(GetHorizon()==MAXHORIZON)
            throw(E("PlanningUnitMADPDiscrete::GetTimeStepForJAOHI does not work yet for infinite-horizon case"));

        while( t < GetHorizon() && _m_firstJAOHIforT[t] <= jaohI )
            t++;
        //  _m_firstJAOHIforT[t] > johI  OR t==GetHorizon
        if(t == GetHorizon())
            t--; //last time step is h-1
        else
            t--;//_m_nrJointActionObservationHistoriesT[t] > jaohI so
                //johI belongs to previous time step.
        return(t);
    }
}